

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

void decode_residue(vorb *f,float **residue_buffers,wchar_t ch,wchar_t n,wchar_t rn,
                   uint8 *do_not_decode)

{
  byte bVar1;
  uint32 uVar2;
  undefined8 uVar3;
  float **ppfVar4;
  uint uVar5;
  wchar_t wVar6;
  uint uVar7;
  wchar_t wVar8;
  int iVar9;
  long lVar10;
  uint8 *puVar11;
  Codebook *pCVar12;
  int iVar13;
  long lVar14;
  wchar_t wVar15;
  ulong uVar16;
  Codebook *pCVar17;
  ulong uVar18;
  float *pfVar19;
  Residue *pRVar20;
  vorb *pvVar21;
  long lVar22;
  long *plVar23;
  long lVar24;
  float *pfVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  long local_b8;
  wchar_t local_ac;
  long local_a8;
  float **local_a0;
  long local_98;
  wchar_t class_set;
  Codebook *local_88;
  uint8 *local_80;
  ulong local_78;
  long *local_70;
  int local_64;
  ulong local_60;
  Residue *local_58;
  uint16 local_4a;
  wchar_t local_48;
  wchar_t local_44;
  wchar_t c_inter;
  wchar_t p_inter;
  Codebook *local_38;
  
  plVar23 = &local_b8;
  local_80 = do_not_decode;
  local_38 = (Codebook *)CONCAT44(local_38._4_4_,ch);
  pRVar20 = f->residue_config;
  local_4a = f->residue_types[(uint)rn];
  local_78 = (ulong)(uint)n;
  uVar5 = n << (f->residue_types[(uint)rn] == 2);
  local_a8 = (long)f->codebooks[pRVar20[(uint)rn].classbook].dimensions;
  uVar7 = pRVar20[(uint)rn].begin;
  if (uVar5 <= pRVar20[(uint)rn].begin) {
    uVar7 = uVar5;
  }
  if (pRVar20[(uint)rn].end < uVar5) {
    uVar5 = pRVar20[(uint)rn].end;
  }
  local_60 = (ulong)(uVar5 - uVar7) / (ulong)pRVar20[(uint)rn].part_size;
  wVar8 = f->channels;
  local_ac = f->temp_offset;
  iVar13 = (int)local_60;
  if ((f->alloc).alloc_buffer == (char *)0x0) {
    lVar10 = (long)wVar8;
    plVar23 = (long *)((long)&local_b8 -
                      (((long)iVar13 * 8 + 8) * lVar10 + 0xfU & 0xfffffffffffffff0));
    local_70 = plVar23;
  }
  else {
    local_70 = (long *)setup_temp_malloc(f,wVar8 * (iVar13 * 8 + 8));
    wVar8 = f->channels;
    lVar10 = (long)wVar8;
  }
  uVar16 = 0;
  uVar18 = (ulong)(uint)wVar8;
  if (wVar8 < L'\x01') {
    uVar18 = uVar16;
  }
  lVar10 = lVar10 << 3;
  for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
    local_70[uVar16] = (long)local_70 + lVar10;
    lVar10 = lVar10 + iVar13 * 8;
  }
  lVar10 = (long)(int)local_78;
  pCVar12 = (Codebook *)0x0;
  pCVar17 = (Codebook *)0x0;
  if (0 < (wchar_t)local_38) {
    pCVar17 = (Codebook *)((ulong)local_38 & 0xffffffff);
  }
  local_88 = pCVar17;
  puVar11 = local_80;
  for (; pCVar17 != pCVar12; pCVar12 = (Codebook *)((long)&pCVar12->dimensions + 1)) {
    if (puVar11[(long)pCVar12] == '\0') {
      pfVar25 = residue_buffers[(long)pCVar12];
      plVar23[-1] = 0x14275a;
      memset(pfVar25,0,lVar10 << 2);
      puVar11 = local_80;
      pCVar17 = local_88;
    }
  }
  _c_inter = f;
  local_58 = pRVar20 + (uint)rn;
  local_a0 = residue_buffers;
  if ((wchar_t)local_38 == 1 || local_4a != 2) {
    for (_class_set = 0; _class_set != 8; _class_set = _class_set + 1) {
      local_98 = 0;
      local_64 = 0;
      uVar18 = local_60;
      puVar11 = local_80;
      pvVar21 = _c_inter;
      while (local_64 < (int)uVar18) {
        if (_class_set == 0) {
          pRVar20 = local_58;
          for (pCVar17 = (Codebook *)0x0; local_88 != pCVar17;
              pCVar17 = (Codebook *)((long)&pCVar17->dimensions + 1)) {
            if (puVar11[(long)pCVar17] == '\0') {
              pCVar12 = pvVar21->codebooks + pRVar20->classbook;
              if (pvVar21->valid_bits < L'\n') {
                plVar23[-1] = 0x142a94;
                prep_huffman(pvVar21);
              }
              wVar8 = (wchar_t)pCVar12->fast_huffman[pvVar21->acc & 0x3ff];
              if (pCVar12->fast_huffman[pvVar21->acc & 0x3ff] < 0) {
                plVar23[-1] = 0x142ae9;
                wVar8 = codebook_decode_scalar_raw(pvVar21,pCVar12);
              }
              else {
                bVar1 = pCVar12->codeword_lengths[wVar8];
                pvVar21->acc = pvVar21->acc >> (bVar1 & 0x1f);
                wVar15 = pvVar21->valid_bits - (uint)bVar1;
                wVar6 = wVar15;
                if (wVar15 < L'\x01') {
                  wVar6 = L'\0';
                }
                plVar23[-1] = 0xffffffffffffffff;
                if (wVar15 < L'\0') {
                  wVar8 = (wchar_t)plVar23[-1];
                }
                pvVar21->valid_bits = wVar6;
              }
              if (pCVar12->sparse != '\0') {
                wVar8 = pCVar12->sorted_values[wVar8];
              }
              if (wVar8 == L'\xffffffff') goto LAB_00142b57;
              *(uint8 **)(local_70[(long)pCVar17] + local_98 * 8) = local_58->classdata[wVar8];
              puVar11 = local_80;
              pRVar20 = local_58;
              pvVar21 = _c_inter;
            }
          }
        }
        lVar10 = 0;
        uVar18 = local_60;
        pCVar17 = local_88;
        for (; (lVar10 < local_a8 && (local_64 < (int)uVar18)); local_64 = local_64 + 1) {
          local_b8 = lVar10;
          pCVar12 = (Codebook *)0x0;
          while (pCVar12 != pCVar17) {
            local_38 = pCVar12;
            if ((puVar11[(long)pCVar12] == '\0') &&
               (lVar10 = (long)local_58->residue_books
                               [*(byte *)(*(long *)(local_70[(long)pCVar12] + local_98 * 8) +
                                         local_b8)][_class_set], -1 < lVar10)) {
              uVar2 = local_58->part_size;
              pCVar17 = _c_inter->codebooks + lVar10;
              pfVar25 = local_a0[(long)pCVar12];
              if (local_4a == 0) {
                uVar7 = (int)uVar2 / pCVar17->dimensions;
                local_78 = 0;
                if (0 < (int)uVar7) {
                  local_78 = (ulong)uVar7;
                }
                iVar13 = uVar2 * local_64 + local_58->begin;
                pfVar25 = pfVar25 + iVar13;
                wVar8 = uVar2 - iVar13;
                for (uVar18 = 0; pvVar21 = _c_inter, uVar18 != local_78; uVar18 = uVar18 + 1) {
                  plVar23[-1] = 0x1429e3;
                  wVar6 = codebook_decode_start(pvVar21,pCVar17);
                  if (wVar6 < L'\0') goto LAB_00142b57;
                  wVar15 = pCVar17->dimensions;
                  lVar10 = (long)(wVar6 * wVar15);
                  if (wVar8 <= wVar15) {
                    wVar15 = wVar8;
                  }
                  uVar16 = (ulong)(uint)wVar15;
                  if (wVar15 < L'\x01') {
                    uVar16 = 0;
                  }
                  fVar27 = 0.0;
                  pfVar19 = pfVar25;
                  while (bVar26 = uVar16 != 0, uVar16 = uVar16 - 1, bVar26) {
                    fVar28 = pCVar17->multiplicands[lVar10] + fVar27;
                    *pfVar19 = *pfVar19 + fVar28;
                    if (pCVar17->sequence_p != '\0') {
                      fVar27 = fVar28;
                    }
                    pfVar19 = pfVar19 + (int)uVar7;
                    lVar10 = lVar10 + 1;
                  }
                  pfVar25 = pfVar25 + 1;
                  wVar8 = wVar8 + L'\xffffffff';
                }
              }
              else {
                iVar9 = uVar2 * local_64 + local_58->begin;
                iVar13 = 0;
                while (pvVar21 = _c_inter, wVar8 = uVar2 - iVar13,
                      wVar8 != L'\0' && iVar13 <= (int)uVar2) {
                  local_78 = CONCAT44(local_78._4_4_,iVar13);
                  plVar23[-1] = 0x1428e9;
                  wVar6 = codebook_decode_start(pvVar21,pCVar17);
                  if (wVar6 < L'\0') goto LAB_00142b57;
                  wVar15 = pCVar17->dimensions;
                  if (wVar15 < wVar8) {
                    wVar8 = wVar15;
                  }
                  if (wVar8 < L'\x01') {
                    wVar8 = L'\0';
                  }
                  if (pCVar17->sequence_p == '\0') {
                    for (uVar18 = 0; (uint)wVar8 != uVar18; uVar18 = uVar18 + 1) {
                      pfVar25[(long)iVar9 + uVar18] =
                           pCVar17->multiplicands[(long)(wVar6 * wVar15) + uVar18] + 0.0 +
                           pfVar25[(long)iVar9 + uVar18];
                    }
                  }
                  else {
                    fVar27 = 0.0;
                    for (uVar18 = 0; (uint)wVar8 != uVar18; uVar18 = uVar18 + 1) {
                      fVar27 = fVar27 + pCVar17->multiplicands[(long)(wVar6 * wVar15) + uVar18];
                      pfVar25[(long)iVar9 + uVar18] = pfVar25[(long)iVar9 + uVar18] + fVar27;
                      fVar27 = fVar27 + pCVar17->minimum_value;
                    }
                  }
                  iVar9 = iVar9 + pCVar17->dimensions;
                  iVar13 = (int)local_78 + pCVar17->dimensions;
                }
              }
            }
            uVar18 = local_60;
            puVar11 = local_80;
            pCVar17 = local_88;
            pCVar12 = (Codebook *)((long)&local_38->dimensions + 1);
          }
          lVar10 = local_b8 + 1;
          pvVar21 = _c_inter;
        }
        local_98 = local_98 + 1;
      }
    }
  }
  else {
    for (pCVar12 = (Codebook *)0x0; pCVar17 != pCVar12;
        pCVar12 = (Codebook *)((long)&pCVar12->dimensions + 1)) {
      if (local_80[(long)pCVar12] == '\0') {
        pCVar17 = (Codebook *)((ulong)pCVar12 & 0xffffffff);
        break;
      }
    }
    if ((int)pCVar17 != (wchar_t)local_38) {
      for (lVar10 = 0; pvVar21 = _c_inter, lVar10 != 8; lVar10 = lVar10 + 1) {
        if ((wchar_t)local_38 == 2) {
          lVar22 = 0;
          iVar13 = 0;
          uVar18 = local_60;
          while (iVar13 < (int)uVar18) {
            uVar7 = local_58->part_size * iVar13 + local_58->begin;
            local_48 = uVar7 & 1;
            local_44 = (int)uVar7 >> 1;
            if (lVar10 == 0) {
              pCVar17 = pvVar21->codebooks + local_58->classbook;
              if (pvVar21->valid_bits < L'\n') {
                plVar23[-1] = 0x142bec;
                prep_huffman(pvVar21);
              }
              wVar8 = (wchar_t)pCVar17->fast_huffman[pvVar21->acc & 0x3ff];
              if (pCVar17->fast_huffman[pvVar21->acc & 0x3ff] < 0) {
                plVar23[-1] = 0x142c49;
                wVar8 = codebook_decode_scalar_raw(pvVar21,pCVar17);
              }
              else {
                bVar1 = pCVar17->codeword_lengths[wVar8];
                pvVar21->acc = pvVar21->acc >> (bVar1 & 0x1f);
                wVar15 = pvVar21->valid_bits - (uint)bVar1;
                wVar6 = wVar15;
                if (wVar15 < L'\x01') {
                  wVar6 = L'\0';
                }
                plVar23[-1] = 0xffffffffffffffff;
                if (wVar15 < L'\0') {
                  wVar8 = (wchar_t)plVar23[-1];
                }
                pvVar21->valid_bits = wVar6;
              }
              if (pCVar17->sparse != '\0') {
                wVar8 = pCVar17->sorted_values[wVar8];
              }
              if (wVar8 == L'\xffffffff') goto LAB_00142b57;
              *(uint8 **)(*local_70 + lVar22 * 8) = local_58->classdata[wVar8];
              uVar18 = local_60;
            }
            lVar24 = 0;
            for (; (ppfVar4 = local_a0, lVar24 < local_a8 && (iVar13 < (int)uVar18));
                iVar13 = iVar13 + 1) {
              uVar7 = local_58->part_size;
              lVar14 = (long)local_58->residue_books
                             [*(byte *)(*(long *)(*local_70 + lVar22 * 8) + lVar24)][lVar10];
              if (lVar14 < 0) {
                uVar7 = uVar7 * (iVar13 + 1) + local_58->begin;
                local_48 = uVar7 & 1;
                local_44 = (int)uVar7 >> 1;
              }
              else {
                pCVar17 = pvVar21->codebooks;
                plVar23[-1] = 2;
                uVar3 = plVar23[-1];
                plVar23[-1] = (ulong)uVar7;
                plVar23[-2] = local_78;
                plVar23[-3] = 0x142cf0;
                wVar8 = codebook_decode_deinterleave_repeat
                                  (pvVar21,pCVar17 + lVar14,ppfVar4,(wchar_t)uVar3,&local_48,
                                   &local_44,*(wchar_t *)(plVar23 + -2),*(wchar_t *)(plVar23 + -1));
                if (wVar8 == L'\0') goto LAB_00142b57;
              }
              lVar24 = lVar24 + 1;
              uVar18 = local_60;
            }
            lVar22 = lVar22 + 1;
          }
        }
        else if (2 < (wchar_t)local_38) {
          lVar22 = 0;
          iVar13 = 0;
          while (pvVar21 = _c_inter, pRVar20 = local_58, iVar13 < (int)local_60) {
            iVar9 = local_58->part_size * iVar13 + local_58->begin;
            local_48 = iVar9 % (wchar_t)local_38;
            local_44 = iVar9 / (wchar_t)local_38;
            if (lVar10 == 0) {
              pCVar17 = _c_inter->codebooks + local_58->classbook;
              if (_c_inter->valid_bits < L'\n') {
                local_88 = _c_inter->codebooks + local_58->classbook;
                plVar23[-1] = 0x142d93;
                prep_huffman(pvVar21);
                pCVar17 = local_88;
              }
              wVar8 = (wchar_t)pCVar17->fast_huffman[pvVar21->acc & 0x3ff];
              if (pCVar17->fast_huffman[pvVar21->acc & 0x3ff] < 0) {
                plVar23[-1] = 0x142df3;
                wVar8 = codebook_decode_scalar_raw(pvVar21,pCVar17);
              }
              else {
                bVar1 = pCVar17->codeword_lengths[wVar8];
                pvVar21->acc = pvVar21->acc >> (bVar1 & 0x1f);
                wVar15 = pvVar21->valid_bits - (uint)bVar1;
                wVar6 = wVar15;
                if (wVar15 < L'\x01') {
                  wVar6 = L'\0';
                }
                plVar23[-1] = 0xffffffffffffffff;
                if (wVar15 < L'\0') {
                  wVar8 = (wchar_t)plVar23[-1];
                }
                pvVar21->valid_bits = wVar6;
              }
              if (pCVar17->sparse != '\0') {
                wVar8 = pCVar17->sorted_values[wVar8];
              }
              if (wVar8 == L'\xffffffff') goto LAB_00142b57;
              *(uint8 **)(*local_70 + lVar22 * 8) = pRVar20->classdata[wVar8];
            }
            lVar24 = 0;
            for (; (pvVar21 = _c_inter, ppfVar4 = local_a0, lVar24 < local_a8 &&
                   (iVar13 < (int)local_60)); iVar13 = iVar13 + 1) {
              lVar14 = (long)pRVar20->residue_books
                             [*(byte *)(*(long *)(*local_70 + lVar22 * 8) + lVar24)][lVar10];
              wVar8 = (wchar_t)local_38;
              if (lVar14 < 0) {
                iVar9 = pRVar20->part_size * (iVar13 + 1) + pRVar20->begin;
                local_48 = iVar9 % (wchar_t)local_38;
                local_44 = iVar9 / (wchar_t)local_38;
              }
              else {
                pCVar17 = _c_inter->codebooks;
                plVar23[-1] = (ulong)pRVar20->part_size;
                plVar23[-2] = local_78;
                plVar23[-3] = 0x142e91;
                wVar8 = codebook_decode_deinterleave_repeat
                                  (pvVar21,pCVar17 + lVar14,ppfVar4,wVar8,&local_48,&local_44,
                                   *(wchar_t *)(plVar23 + -2),*(wchar_t *)(plVar23 + -1));
                if (wVar8 == L'\0') goto LAB_00142b57;
              }
              lVar24 = lVar24 + 1;
            }
            lVar22 = lVar22 + 1;
          }
        }
      }
    }
  }
LAB_00142b57:
  _c_inter->temp_offset = local_ac;
  return;
}

Assistant:

static void decode_residue(vorb *f, float *residue_buffers[], int ch, int n, int rn, uint8 *do_not_decode)
{
   int i,j,pass;
   Residue *r = f->residue_config + rn;
   int rtype = f->residue_types[rn];
   int c = r->classbook;
   int classwords = f->codebooks[c].dimensions;
   unsigned int actual_size = rtype == 2 ? n*2 : n;
   unsigned int limit_r_begin = (r->begin < actual_size ? r->begin : actual_size);
   unsigned int limit_r_end   = (r->end   < actual_size ? r->end   : actual_size);
   int n_read = limit_r_end - limit_r_begin;
   int part_read = n_read / r->part_size;
   int temp_alloc_point = temp_alloc_save(f);
   #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
   uint8 ***part_classdata = (uint8 ***) temp_block_array(f,f->channels, part_read * sizeof(**part_classdata));
   #else
   int **classifications = (int **) temp_block_array(f,f->channels, part_read * sizeof(**classifications));
   #endif

   CHECK(f);

   for (i=0; i < ch; ++i)
      if (!do_not_decode[i])
         memset(residue_buffers[i], 0, sizeof(float) * n);

   if (rtype == 2 && ch != 1) {
      for (j=0; j < ch; ++j)
         if (!do_not_decode[j])
            break;
      if (j == ch)
         goto done;

      for (pass=0; pass < 8; ++pass) {
         int pcount = 0, class_set = 0;
         if (ch == 2) {
            while (pcount < part_read) {
               int z = r->begin + pcount*r->part_size;
               int c_inter = (z & 1), p_inter = z>>1;
               if (pass == 0) {
                  Codebook *c = f->codebooks+r->classbook;
                  int q;
                  DECODE(q,f,c);
                  if (q == EOP) goto done;
                  #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
                  part_classdata[0][class_set] = r->classdata[q];
                  #else
                  for (i=classwords-1; i >= 0; --i) {
                     classifications[0][i+pcount] = q % r->classifications;
                     q /= r->classifications;
                  }
                  #endif
               }
               for (i=0; i < classwords && pcount < part_read; ++i, ++pcount) {
                  int z = r->begin + pcount*r->part_size;
                  #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
                  int c = part_classdata[0][class_set][i];
                  #else
                  int c = classifications[0][pcount];
                  #endif
                  int b = r->residue_books[c][pass];
                  if (b >= 0) {
                     Codebook *book = f->codebooks + b;
                     #ifdef STB_VORBIS_DIVIDES_IN_CODEBOOK
                     if (!codebook_decode_deinterleave_repeat(f, book, residue_buffers, ch, &c_inter, &p_inter, n, r->part_size))
                        goto done;
                     #else
                     // saves 1%
                     if (!codebook_decode_deinterleave_repeat(f, book, residue_buffers, ch, &c_inter, &p_inter, n, r->part_size))
                        goto done;
                     #endif
                  } else {
                     z += r->part_size;
                     c_inter = z & 1;
                     p_inter = z >> 1;
                  }
               }
               #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
               ++class_set;
               #endif
            }
         } else if (ch > 2) {
            while (pcount < part_read) {
               int z = r->begin + pcount*r->part_size;
               int c_inter = z % ch, p_inter = z/ch;
               if (pass == 0) {
                  Codebook *c = f->codebooks+r->classbook;
                  int q;
                  DECODE(q,f,c);
                  if (q == EOP) goto done;
                  #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
                  part_classdata[0][class_set] = r->classdata[q];
                  #else
                  for (i=classwords-1; i >= 0; --i) {
                     classifications[0][i+pcount] = q % r->classifications;
                     q /= r->classifications;
                  }
                  #endif
               }
               for (i=0; i < classwords && pcount < part_read; ++i, ++pcount) {
                  int z = r->begin + pcount*r->part_size;
                  #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
                  int c = part_classdata[0][class_set][i];
                  #else
                  int c = classifications[0][pcount];
                  #endif
                  int b = r->residue_books[c][pass];
                  if (b >= 0) {
                     Codebook *book = f->codebooks + b;
                     if (!codebook_decode_deinterleave_repeat(f, book, residue_buffers, ch, &c_inter, &p_inter, n, r->part_size))
                        goto done;
                  } else {
                     z += r->part_size;
                     c_inter = z % ch;
                     p_inter = z / ch;
                  }
               }
               #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
               ++class_set;
               #endif
            }
         }
      }
      goto done;
   }
   CHECK(f);

   for (pass=0; pass < 8; ++pass) {
      int pcount = 0, class_set=0;
      while (pcount < part_read) {
         if (pass == 0) {
            for (j=0; j < ch; ++j) {
               if (!do_not_decode[j]) {
                  Codebook *c = f->codebooks+r->classbook;
                  int temp;
                  DECODE(temp,f,c);
                  if (temp == EOP) goto done;
                  #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
                  part_classdata[j][class_set] = r->classdata[temp];
                  #else
                  for (i=classwords-1; i >= 0; --i) {
                     classifications[j][i+pcount] = temp % r->classifications;
                     temp /= r->classifications;
                  }
                  #endif
               }
            }
         }
         for (i=0; i < classwords && pcount < part_read; ++i, ++pcount) {
            for (j=0; j < ch; ++j) {
               if (!do_not_decode[j]) {
                  #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
                  int c = part_classdata[j][class_set][i];
                  #else
                  int c = classifications[j][pcount];
                  #endif
                  int b = r->residue_books[c][pass];
                  if (b >= 0) {
                     float *target = residue_buffers[j];
                     int offset = r->begin + pcount * r->part_size;
                     int n = r->part_size;
                     Codebook *book = f->codebooks + b;
                     if (!residue_decode(f, book, target, offset, n, rtype))
                        goto done;
                  }
               }
            }
         }
         #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
         ++class_set;
         #endif
      }
   }
  done:
   CHECK(f);
   #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
   temp_free(f,part_classdata);
   #else
   temp_free(f,classifications);
   #endif
   temp_alloc_restore(f,temp_alloc_point);
}